

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_verify_pss.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  size_t sig_len;
  mbedtls_md_info_t *md_info;
  char *pcVar3;
  int iVar4;
  mbedtls_pk_context pk;
  uchar hash [32];
  char filename [512];
  uchar buf [1024];
  mbedtls_pk_context mStack_668;
  uchar local_658 [32];
  char local_638 [512];
  uchar local_438 [1032];
  
  mbedtls_pk_init(&mStack_668);
  if (argc == 3) {
    printf("\n  . Reading public key from \'%s\'",argv[1]);
    fflush(_stdout);
    uVar1 = mbedtls_pk_parse_public_keyfile(&mStack_668,argv[1]);
    if (uVar1 == 0) {
      iVar4 = 1;
      iVar2 = mbedtls_pk_can_do(&mStack_668,MBEDTLS_PK_RSA);
      if (iVar2 == 0) {
        pcVar3 = " failed\n  ! Key is not an RSA key";
      }
      else {
        iVar4 = 1;
        mbedtls_rsa_set_padding((mbedtls_rsa_context *)mStack_668.pk_ctx,1,6);
        snprintf(local_638,0x200,"%s.sig",argv[2]);
        __stream = fopen(local_638,"rb");
        if (__stream == (FILE *)0x0) {
          printf("\n  ! Could not open %s\n\n",local_638);
          goto LAB_0010b339;
        }
        sig_len = fread(local_438,1,0x400,__stream);
        fclose(__stream);
        printf("\n  . Verifying the RSA/SHA-256 signature");
        fflush(_stdout);
        md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
        iVar2 = mbedtls_md_file(md_info,argv[2],local_658);
        if (iVar2 != 0) {
          printf(" failed\n  ! Could not open or read %s\n\n",argv[2]);
          goto LAB_0010b333;
        }
        iVar4 = 0;
        uVar1 = mbedtls_pk_verify(&mStack_668,MBEDTLS_MD_SHA256,local_658,0,local_438,sig_len);
        if (uVar1 != 0) {
          pcVar3 = " failed\n  ! mbedtls_pk_verify returned %d\n\n";
          goto LAB_0010b31e;
        }
        pcVar3 = "\n  . OK (the signature is valid)\n";
      }
      puts(pcVar3);
      goto LAB_0010b339;
    }
    printf(" failed\n  ! Could not read key from \'%s\'\n",argv[1]);
    pcVar3 = "  ! mbedtls_pk_parse_public_keyfile returned %d\n\n";
LAB_0010b31e:
    printf(pcVar3,(ulong)uVar1);
  }
  else {
    puts("usage: rsa_verify_pss <key_file> <filename>");
  }
LAB_0010b333:
  iVar4 = 1;
LAB_0010b339:
  mbedtls_pk_free(&mStack_668);
  return iVar4;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i;
    mbedtls_pk_context pk;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_pk_init( &pk );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: rsa_verify_pss <key_file> <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_public_keyfile( &pk, argv[1] ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not read key from '%s'\n", argv[1] );
        mbedtls_printf( "  ! mbedtls_pk_parse_public_keyfile returned %d\n\n", ret );
        goto exit;
    }

    if( !mbedtls_pk_can_do( &pk, MBEDTLS_PK_RSA ) )
    {
        mbedtls_printf( " failed\n  ! Key is not an RSA key\n" );
        goto exit;
    }

    mbedtls_rsa_set_padding( mbedtls_pk_rsa( pk ), MBEDTLS_RSA_PKCS_V21, MBEDTLS_MD_SHA256 );

    /*
     * Extract the RSA signature from the file
     */
    mbedtls_snprintf( filename, 512, "%s.sig", argv[2] );

    if( ( f = fopen( filename, "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", filename );
        goto exit;
    }

    i = fread( buf, 1, MBEDTLS_MPI_MAX_SIZE, f );

    fclose( f );

    /*
     * Compute the SHA-256 hash of the input file and
     * verify the signature
     */
    mbedtls_printf( "\n  . Verifying the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[2], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[2] );
        goto exit;
    }

    if( ( ret = mbedtls_pk_verify( &pk, MBEDTLS_MD_SHA256, hash, 0,
                           buf, i ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_verify returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK (the signature is valid)\n\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_pk_free( &pk );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}